

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O2

List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *
Lib::List<Inferences::ALASCA::BinaryResolutionConf::Lhs>::cons
          (Lhs *elem,List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *l)

{
  List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *this;
  SelectedLiteral SStack_48;
  
  this = (List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *)operator_new(0x38);
  Kernel::SelectedLiteral::SelectedLiteral(&SStack_48,&elem->super_SelectedLiteral);
  Kernel::SelectedLiteral::SelectedLiteral((SelectedLiteral *)this,&SStack_48);
  this->_tail = l;
  return this;
}

Assistant:

static List* cons(C elem, List* l)
  {
    return new List(elem, l);
  }